

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O2

void golf_shader_uniform_set_vec4(golf_shader_uniform_t *uniform,char *name,vec4 v)

{
  char *__s1;
  float *pfVar1;
  uint uVar2;
  golf_shader_uniform_member_t *pgVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  float local_58;
  float fStack_54;
  
  uVar2 = (uniform->members).length;
  uVar7 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar7;
  }
  pcVar6 = (char *)0x0;
  for (; uVar5 * 0x48 - uVar7 != 0; uVar7 = uVar7 + 0x48) {
    pgVar3 = (uniform->members).data;
    __s1 = pgVar3->name + uVar7;
    iVar4 = strcmp(__s1,name);
    if ((iVar4 == 0) && (*(int *)(pgVar3->name + uVar7 + 0x44) == 0x10)) {
      pcVar6 = __s1;
    }
  }
  if (pcVar6 != (char *)0x0) {
    local_58 = v.x;
    fStack_54 = v.y;
    pfVar1 = (float *)(uniform->data + *(int *)(pcVar6 + 0x40));
    *pfVar1 = local_58;
    pfVar1[1] = fStack_54;
    pfVar1[2] = v.z;
    pfVar1[3] = v.w;
    return;
  }
  golf_log_warning("Unable to find vec4 member: %s",name);
  return;
}

Assistant:

void golf_shader_uniform_set_vec4(golf_shader_uniform_t *uniform, const char *name, vec4 v) {
    golf_shader_uniform_member_t *member = NULL;
    for (int i = 0; i < uniform->members.length; i++) {
        if ((strcmp(uniform->members.data[i].name, name) == 0) && uniform->members.data[i].size == 16) {
            member = &uniform->members.data[i];
        }
    }
    if (!member) {
        golf_log_warning("Unable to find vec4 member: %s", name);
        return;
    }
    memcpy(uniform->data + member->offset, &v, 16);
}